

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTextureCubeShadowGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float r;
  float *pfVar1;
  float lod;
  float fVar2;
  TexLookupParams *param_1_local;
  ShaderEvalContext *c_local;
  
  pfVar1 = tcu::Vector<float,_4>::w(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y(c->in);
  t = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::z(c->in);
  r = *pfVar1;
  lod = computeLodFromGradCube(c);
  fVar2 = textureCubeShadow(c,fVar2,s,t,r,lod);
  pfVar1 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar1 = fVar2;
  return;
}

Assistant:

static void		evalTextureCubeShadowGrad		(gls::ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = textureCubeShadow(c, c.in[0].w(), c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGradCube(c)); }